

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

void __thiscall ExtraData::parseFullScreen(ExtraData *this)

{
  uint uVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  ExtraData *local_10;
  ExtraData *this_local;
  
  local_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_28,&(this->CONSOLE_PROPS).FullScreen);
  uVar1 = Utils::lenFourBytes(&local_28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_28);
  if (uVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Full-screen mode is off.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Full-screen mode is on.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ExtraData::parseFullScreen() {
    if (Utils::lenFourBytes(CONSOLE_PROPS.FullScreen) > 0x00000000)
        cout << "Full-screen mode is on." << endl;
    else
        cout << "Full-screen mode is off." << endl;
}